

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionEuler.h
# Opt level: O1

void __thiscall
chrono::fea::ChBeamSectionRayleighEasyRectangular::~ChBeamSectionRayleighEasyRectangular
          (ChBeamSectionRayleighEasyRectangular *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  (this->super_ChBeamSectionRayleighSimple).super_ChBeamSectionEulerSimple.super_ChBeamSectionEuler.
  super_ChBeamSection._vptr_ChBeamSection = (_func_int **)&PTR__ChBeamSection_00b4ddf8;
  this_00 = (this->super_ChBeamSectionRayleighSimple).super_ChBeamSectionEulerSimple.
            super_ChBeamSectionEuler.super_ChBeamSection.draw_shape.
            super___shared_ptr<chrono::fea::ChBeamSectionShape,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  operator_delete(this,0x80);
  return;
}

Assistant:

class ChApi ChBeamSectionRayleighEasyRectangular : public ChBeamSectionRayleighSimple {
  public:
      ChBeamSectionRayleighEasyRectangular(double width_y,  ///< width of section in y direction
          double width_z,  ///< width of section in z direction
          double E,        ///< Young modulus
          double G,        ///< Shear modulus (only needed for the torsion)
          double density   ///< volumetric density (ex. in SI units: [kg/m^3])
      );
}